

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

bool __thiscall ON_3dmUnitsAndTolerances::TolerancesAreValid(ON_3dmUnitsAndTolerances *this)

{
  if ((((0.0 < this->m_absolute_tolerance) && (0.0 < this->m_angle_tolerance)) &&
      (this->m_angle_tolerance <= 3.141592653589793)) &&
     ((0.0 < this->m_relative_tolerance && (this->m_relative_tolerance < 1.0)))) {
    return true;
  }
  return false;
}

Assistant:

bool ON_3dmUnitsAndTolerances::TolerancesAreValid() const
{
  for (;;)
  {
    if (!(m_absolute_tolerance > 0.0))
      break;

    if (!(m_angle_tolerance > 0.0 && m_angle_tolerance <= ON_PI))
      break;

    if (!(m_relative_tolerance > 0.0 && m_relative_tolerance < 1.0))
      break;

    return true;
  }
  return false;
}